

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::Iterator::updateTriplet(Iterator *this)

{
  int iVar1;
  double *pdVar2;
  reference pvVar3;
  size_t sVar4;
  long *in_RDI;
  
  pdVar2 = VectorDynSize::operator()((VectorDynSize *)*in_RDI,(long)(int)in_RDI[1]);
  in_RDI[3] = (long)pdVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x20),(long)(int)in_RDI[1]);
  *(value_type *)(in_RDI + 2) = *pvVar3;
  iVar1 = (int)in_RDI[4] + -1;
  *(int *)(in_RDI + 4) = iVar1;
  if (iVar1 < 1) {
    *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
    while (iVar1 = *(int *)((long)in_RDI + 0x14),
          sVar4 = columns((SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)*in_RDI),
          (ulong)(long)iVar1 < sVar4) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x38),
                          (long)(*(int *)((long)in_RDI + 0x14) + 1));
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x38),
                          (long)*(int *)((long)in_RDI + 0x14));
      *(int *)(in_RDI + 4) = iVar1 - *pvVar3;
      if (0 < (int)in_RDI[4]) {
        return;
      }
      *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
    }
  }
  return;
}

Assistant:

void SparseMatrix<iDynTree::ColumnMajor>::Iterator::updateTriplet()
    {
        m_currentTriplet.m_value = &(m_matrix.m_values(m_index));
        m_currentTriplet.m_row = m_matrix.m_innerIndices[m_index];

        if (--m_nonZerosInOuterDirection <= 0) {
            m_currentTriplet.m_column++;
            while (static_cast<std::size_t>(m_currentTriplet.m_column) < m_matrix.columns()) {
                //compute row NNZ
                m_nonZerosInOuterDirection = m_matrix.m_outerStarts[m_currentTriplet.m_column + 1]
                - m_matrix.m_outerStarts[m_currentTriplet.m_column];
                if (m_nonZerosInOuterDirection > 0)
                    break;

                //increment row
                m_currentTriplet.m_column++;
            }
        }
    }